

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall
QWhatsThat::QWhatsThat(QWhatsThat *this,QString *txt,QWidget *parent,QWidget *showTextFor)

{
  QFont *pQVar1;
  undefined1 auVar2 [16];
  char cVar3;
  bool bVar4;
  int iVar5;
  QPalette *palette;
  QTextDocument *this_00;
  QSize QVar6;
  int extraout_EDX;
  uint uVar7;
  uint w;
  long in_FS_OFFSET;
  QRect QVar8;
  QAnyStringView QVar9;
  QSizeF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x9);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007c6ae0;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWhatsThat_007c6c90;
  QPointer<QWidget>::QPointer<void>(&this->widget,showTextFor);
  this->pressed = false;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->text).d,&txt->d);
  (this->anchor).d.size = 0;
  (this->anchor).d.d = (Data *)0x0;
  (this->anchor).d.ptr = (char16_t *)0x0;
  if (instance != (QWhatsThat *)0x0) {
    (**(code **)(*(long *)&instance->super_QWidget + 0x20))();
  }
  instance = this;
  QWidget::setAttribute(&this->super_QWidget,WA_DeleteOnClose,true);
  QWidget::setAttribute(&this->super_QWidget,WA_NoSystemBackground,true);
  if (parent != (QWidget *)0x0) {
    palette = QWidget::palette(parent);
    QWidget::setPalette(&this->super_QWidget,palette);
  }
  QWidget::setMouseTracking(&this->super_QWidget,true);
  QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
  QCursor::QCursor((QCursor *)&local_48,ArrowCursor);
  QWidget::setCursor(&this->super_QWidget,(QCursor *)&local_48);
  QCursor::~QCursor((QCursor *)&local_48);
  this->doc = (QTextDocument *)0x0;
  QWidget::ensurePolished(&this->super_QWidget);
  QVar9.m_size = (this->text).d.size | 0x8000000000000000;
  QVar9.field_0.m_data_utf16 = (this->text).d.ptr;
  cVar3 = Qt::mightBeRichText(QVar9);
  if (cVar3 == '\0') {
    QGuiApplication::primaryScreen();
    iVar5 = QScreen::virtualGeometry();
    uVar7 = (extraout_EDX - iVar5) + 1;
    w = 200;
    if (599 < (int)uVar7) {
      uVar7 = uVar7 / 3;
      w = 300;
      if (uVar7 < 300) {
        w = uVar7;
      }
    }
    QWidget::fontMetrics((QWidget *)&local_48);
    QVar8 = QFontMetrics::boundingRect
                      ((QFontMetrics *)&local_48,0,0,w,1000,0x1421,&this->text,0,(int *)0x0);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_48);
  }
  else {
    this_00 = (QTextDocument *)operator_new(0x10);
    QTextDocument::QTextDocument(this_00,(QObject *)0x0);
    this->doc = this_00;
    QTextDocument::setUndoRedoEnabled(SUB81(this_00,0));
    pQVar1 = (QFont *)this->doc;
    QApplication::font((QApplication *)&local_48,&this->super_QWidget);
    QTextDocument::setDefaultFont(pQVar1);
    QFont::~QFont((QFont *)&local_48);
    QTextDocument::setHtml((QString *)this->doc);
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
    QTextDocument::adjustSize();
    local_48.wd = (qreal)QTextDocument::size();
    QVar6 = QSizeF::toSize(&local_48);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = ((ulong)(QVar6.wd.m_i.m_i - 1) | (ulong)QVar6 & 0xffffffff00000000) - 0x100000000
    ;
    QVar8 = (QRect)(auVar2 << 0x40);
  }
  bVar4 = dropShadow();
  shadowWidth = 6;
  if (bVar4) {
    shadowWidth = 0;
  }
  QWidget::resize(&this->super_QWidget,(QVar8.x2.m_i.m_i - QVar8.x1.m_i) + shadowWidth + 0x19,
                  (QVar8.y2.m_i.m_i - QVar8.y1.m_i) + shadowWidth + 0x11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThat::QWhatsThat(const QString& txt, QWidget* parent, QWidget *showTextFor)
    : QWidget(parent, Qt::Popup),
      widget(showTextFor), pressed(false), text(txt)
{
    delete instance;
    instance = this;
    setAttribute(Qt::WA_DeleteOnClose, true);
    setAttribute(Qt::WA_NoSystemBackground, true);
    if (parent)
        setPalette(parent->palette());
    setMouseTracking(true);
    setFocusPolicy(Qt::StrongFocus);
#ifndef QT_NO_CURSOR
    setCursor(Qt::ArrowCursor);
#endif
    QRect r;
    doc = nullptr;
    ensurePolished(); // Ensures style sheet font before size calc
    if (Qt::mightBeRichText(text)) {
        doc = new QTextDocument();
        doc->setUndoRedoEnabled(false);
        doc->setDefaultFont(QApplication::font(this));
#ifdef QT_NO_TEXTHTMLPARSER
        doc->setPlainText(text);
#else
        doc->setHtml(text);
#endif
        doc->setUndoRedoEnabled(false);
        doc->adjustSize();
        r.setTop(0);
        r.setLeft(0);
        r.setSize(doc->size().toSize());
    }
    else
    {
        int sw = QGuiApplication::primaryScreen()->virtualGeometry().width() / 3;
        if (sw < 200)
            sw = 200;
        else if (sw > 300)
            sw = 300;

        r = fontMetrics().boundingRect(0, 0, sw, 1000,
                                        Qt::AlignLeft | Qt::AlignTop
                                        | Qt::TextWordWrap | Qt::TextExpandTabs,
                                        text);
    }
    shadowWidth = dropShadow() ? 0 : 6;
    resize(r.width() + 2*hMargin + shadowWidth, r.height() + 2*vMargin + shadowWidth);
}